

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O1

bool __thiscall
Shell::EqualityProxyMono::getArgumentEqualityLiterals
          (EqualityProxyMono *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType,bool skipSortsWithoutEquality)

{
  uint predicate;
  TermList sort;
  Entry *pEVar1;
  Literal *pLVar2;
  TermList *pTVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  TermList local_58;
  ulong local_50;
  ulong local_40;
  OperatorType *local_38;
  
  lits->_cursor = lits->_stack;
  vars1->_cursor = vars1->_stack;
  vars2->_cursor = vars2->_stack;
  if (cnt != 0) {
    local_40 = (ulong)cnt;
    uVar6 = 0;
    local_38 = symbolType;
    do {
      if (uVar6 < local_38->_typeArgsArity) {
        sort = Kernel::AtomicSort::superSort();
        this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)this
        ;
      }
      else {
        sort._content =
             *(uint64_t *)(local_38->_key + (ulong)((int)uVar6 - local_38->_typeArgsArity) * 8 + 8);
        this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)this
        ;
      }
      uVar4 = (ulong)(uint)((int)uVar6 * 8);
      uVar5 = uVar4 + 1;
      if (skipSortsWithoutEquality) {
        this_00 = &s_proxyPredicates;
        local_58._content = sort._content;
        pEVar1 = ::Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                 findEntry(&s_proxyPredicates,&local_58);
        if (pEVar1 != (Entry *)0x0) goto LAB_006f0dc5;
        if (vars1->_cursor == vars1->_end) {
          this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    vars1;
          ::Lib::Stack<Kernel::TermList>::expand(vars1);
        }
        pTVar3 = vars1->_cursor;
        pTVar3->_content = uVar5;
        vars1->_cursor = pTVar3 + 1;
        pTVar3 = vars2->_cursor;
      }
      else {
LAB_006f0dc5:
        uVar4 = uVar4 | 5;
        predicate = getProxyPredicate((EqualityProxyMono *)this_00,sort);
        local_58._content = uVar5;
        local_50 = uVar4;
        pLVar2 = Kernel::Literal::create(predicate,2,false,&local_58);
        if (lits->_cursor == lits->_end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(lits);
        }
        *lits->_cursor = pLVar2;
        lits->_cursor = lits->_cursor + 1;
        this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)lits
        ;
        if (vars1->_cursor == vars1->_end) {
          this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    vars1;
          ::Lib::Stack<Kernel::TermList>::expand(vars1);
        }
        pTVar3 = vars1->_cursor;
        pTVar3->_content = uVar5;
        vars1->_cursor = pTVar3 + 1;
        pTVar3 = vars2->_cursor;
        uVar5 = uVar4;
      }
      if (pTVar3 == vars2->_end) {
        this_00 = (DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                  vars2;
        ::Lib::Stack<Kernel::TermList>::expand(vars2);
      }
      pTVar3 = vars2->_cursor;
      pTVar3->_content = uVar5;
      vars2->_cursor = pTVar3 + 1;
      uVar6 = uVar6 + 1;
      this = (EqualityProxyMono *)this_00;
    } while (uVar6 != local_40);
  }
  return lits->_cursor != lits->_stack;
}

Assistant:

bool EqualityProxyMono::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType, bool skipSortsWithoutEquality)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if (!skipSortsWithoutEquality || haveProxyPredicate(sort)) {
      lits.push(makeProxyLiteral(false, v1, v2, sort));
      vars1.push(v1);
      vars2.push(v2);
    }
    else {
      vars1.push(v1);
      vars2.push(v1);
    }
  }
  return lits.isNonEmpty();
}